

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall libtorrent::aux::bt_peer_connection::write_interested(bt_peer_connection *this)

{
  bt_peer_connection *this_local;
  
  send_message<>(this,msg_interested,num_outgoing_interested);
  extension_notify<void(libtorrent::peer_plugin::*)()>(this,0x101);
  return;
}

Assistant:

void bt_peer_connection::write_interested()
	{
		INVARIANT_CHECK;

		send_message(msg_interested, counters::num_outgoing_interested);

#ifndef TORRENT_DISABLE_EXTENSIONS
		extension_notify(&peer_plugin::sent_interested);
#endif
	}